

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cpp
# Opt level: O3

void __thiscall r_exec::_Mem::inject_async(_Mem *this,View *view)

{
  atomic_int_fast64_t *paVar1;
  _func_int **pp_Var2;
  ushort uVar3;
  int iVar4;
  Group *pGVar5;
  ulong uVar6;
  ulong ijt;
  EInjectionJob *this_00;
  
  iVar4 = (*((view->super_View).object.object)->_vptr__Object[0xe])();
  if ((char)iVar4 == '\0') {
    pGVar5 = r_exec::View::get_host(view);
    iVar4 = (*(pGVar5->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object._vptr__Object[0xe])(pGVar5);
    if ((char)iVar4 == '\0') {
      uVar6 = (*Now)();
      uVar3 = r_code::Atom::asIndex();
      ijt = r_code::Utils::GetTimestamp
                      ((Atom *)((long)(view->super_View).references + (ulong)uVar3 * 4 + 0x18));
      if (uVar6 < ijt) {
        pp_Var2 = (view->super_View).object.object[1]._vptr__Object;
        this_00 = (EInjectionJob *)operator_new(0x28);
        if ((long)pp_Var2 < 0) {
          InjectionJob::InjectionJob((InjectionJob *)this_00,view,ijt);
        }
        else {
          EInjectionJob::EInjectionJob(this_00,view,ijt);
        }
        if (this->state != STOPPED) {
          JobQueue<r_exec::TimeJob>::pushJob(&this->m_timeJobQueue,(TimeJob *)this_00);
          return;
        }
      }
      else {
        this_00 = (EInjectionJob *)operator_new(0x20);
        _ReductionJob::_ReductionJob((_ReductionJob *)this_00);
        (this_00->super_TimeJob).super__Object._vptr__Object =
             (_func_int **)&PTR__AsyncInjectionJob_001c11e0;
        (this_00->super_TimeJob).target_time = (uint64_t)view;
        LOCK();
        paVar1 = &(view->super_View).super__Object.refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
        UNLOCK();
        LOCK();
        paVar1 = &(this_00->super_TimeJob).super__Object.refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
        UNLOCK();
        pushReductionJob(this,(_ReductionJob *)this_00);
        LOCK();
        paVar1 = &(this_00->super_TimeJob).super__Object.refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
        UNLOCK();
        if (0 < (this_00->super_TimeJob).super__Object.refCount.super___atomic_base<long>._M_i) {
          return;
        }
      }
      (*(this_00->super_TimeJob).super__Object._vptr__Object[1])(this_00);
      return;
    }
  }
  return;
}

Assistant:

void _Mem::inject_async(View *view)
{
    if (view->object->is_invalidated()) {
        return;
    }

    Group *host = view->get_host();

    if (host->is_invalidated()) {
        return;
    }

    uint64_t now = Now();
    uint64_t ijt = view->get_ijt();

    if (ijt <= now) {
        P<_ReductionJob> j = new AsyncInjectionJob(view);
        pushReductionJob(j);
    } else {
        if (view->object->is_registered()) { // existing object.
            pushTimeJob(new EInjectionJob(view, ijt));
        } else {
            pushTimeJob(new InjectionJob(view, ijt));
        }
    }
}